

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_util.cc
# Opt level: O3

void google::protobuf::anon_unknown_26::ToUint128(Duration *value,uint128 *result,bool *negative)

{
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  uVar1 = value->seconds_;
  uVar2 = value->nanos_;
  if ((int)uVar2 < 0 || (long)uVar1 < 0) {
    *negative = true;
    uVar3 = uVar1 * -1000000000;
    lVar4 = ((-uVar1 >> 0x20) * 1000000000 >> 0x20) +
            (ulong)(uVar3 < (-uVar1 >> 0x20) * 0x3b9aca0000000000);
    uVar2 = -uVar2;
  }
  else {
    *negative = false;
    uVar3 = uVar1 * 1000000000;
    lVar4 = ((uVar1 >> 0x20) * 1000000000 >> 0x20) +
            (ulong)(uVar3 < (uVar1 >> 0x20) * 0x3b9aca0000000000);
  }
  result->lo_ = uVar2 + uVar3;
  result->hi_ = lVar4 + (ulong)CARRY8((ulong)uVar2,uVar3);
  return;
}

Assistant:

void ToUint128(const Duration& value, uint128* result, bool* negative) {
  if (value.seconds() < 0 || value.nanos() < 0) {
    *negative = true;
    *result = static_cast<uint64>(-value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(-value.nanos());
  } else {
    *negative = false;
    *result = static_cast<uint64>(value.seconds());
    *result = *result * kNanosPerSecond + static_cast<uint32>(value.nanos());
  }
}